

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

proxy * __thiscall
cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
alloc<int,cs_impl::any::holder<cs::numeric>*>
          (allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider> *this,
          int *args,holder<cs::numeric> **args_1)

{
  __int_type _Var1;
  holder<cs::numeric> *phVar2;
  proxy *in_RDX;
  new_allocator<cs_impl::any::proxy> *in_RSI;
  holder<cs::numeric> **in_RDI;
  proxy *ptr;
  void *pvVar3;
  
  pvVar3 = (void *)0x0;
  if (in_RDI[0x201] != (holder<cs::numeric> *)0x0) {
    _Var1 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)in_RDX);
    if (_Var1 == 0) {
      phVar2 = in_RDI[0x201];
      in_RDI[0x201] = (holder<cs::numeric> *)&phVar2[-1].mDat.field_0x1f;
      phVar2 = in_RDI[(long)&phVar2[-1].mDat.field_0x1f];
      goto LAB_00126964;
    }
  }
  phVar2 = (holder<cs::numeric> *)
           __gnu_cxx::new_allocator<cs_impl::any::proxy>::allocate(in_RSI,(size_type)in_RDX,pvVar3);
LAB_00126964:
  __gnu_cxx::new_allocator<cs_impl::any::proxy>::
  construct<cs_impl::any::proxy,int,cs_impl::any::holder<cs::numeric>*>
            (in_RSI,in_RDX,(int *)phVar2,in_RDI);
  return (proxy *)phVar2;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}